

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  int iVar1;
  uchar *z;
  uchar *puVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  u64 n;
  int token;
  uchar *local_60;
  char *local_58;
  sqlite3_context *local_50;
  uchar *local_48;
  char *local_40;
  uchar *local_38;
  
  db = context->pOut->db;
  z = sqlite3_value_text(*argv);
  puVar2 = sqlite3_value_text(argv[1]);
  local_48 = sqlite3_value_text(argv[2]);
  if (puVar2 == (uchar *)0x0 || z == (uchar *)0x0) {
    return;
  }
  local_58 = (char *)0x0;
  local_60 = z;
  local_50 = context;
  local_38 = puVar2;
  for (; *z != '\0'; z = z + n) {
    iVar1 = sqlite3GetToken(z,&token);
    if (token == 0x69) {
      do {
        z = z + iVar1;
        iVar1 = sqlite3GetToken(z,&token);
      } while (token == 0x97);
      n = (u64)iVar1;
      pcVar3 = sqlite3DbStrNDup(db,(char *)z,n);
      if (pcVar3 == (char *)0x0) break;
      sqlite3Dequote(pcVar3);
      iVar1 = sqlite3_stricmp((char *)local_38,pcVar3);
      pcVar4 = local_58;
      if (iVar1 == 0) {
        pcVar5 = local_58;
        if (local_58 == (char *)0x0) {
          pcVar5 = "";
        }
        local_40 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar5,(ulong)(uint)((int)z - (int)local_60),
                                  local_60,local_48);
        sqlite3DbFree(db,pcVar4);
        local_60 = z + n;
        local_58 = local_40;
      }
      sqlite3DbFree(db,pcVar3);
    }
    else {
      n = (u64)iVar1;
    }
  }
  pcVar3 = local_58;
  pcVar4 = "";
  if (local_58 != (char *)0x0) {
    pcVar4 = local_58;
  }
  pcVar4 = sqlite3MPrintf(db,"%s%s",pcVar4,local_60);
  sqlite3_result_text(local_50,pcVar4,-1,sqlite3MallocSize);
  sqlite3DbFree(db,pcVar3);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}